

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::Node> *node)

{
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  mapped_type_conflict1 id;
  int iVar3;
  _Base_ptr p_Var4;
  mapped_type_conflict1 *pmVar5;
  ostream *poVar6;
  AnimatedLightNode *pAVar7;
  LightNode *pLVar8;
  TriangleMeshNode *pTVar9;
  QuadMeshNode *pQVar10;
  SubdivMeshNode *pSVar11;
  HairSetNode *pHVar12;
  AnimatedPerspectiveCameraNode *pAVar13;
  PerspectiveCameraNode *pPVar14;
  TransformNode *pTVar15;
  GroupNode *pGVar16;
  runtime_error *this_00;
  _Base_ptr p_Var17;
  ssize_t id_00;
  ssize_t id_01;
  ulong uVar18;
  Ref<embree::SceneGraph::GroupNode> local_80;
  Ref<embree::SceneGraph::TransformNode> local_78;
  Ref<embree::SceneGraph::PerspectiveCameraNode> local_70;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> local_68;
  Ref<embree::SceneGraph::HairSetNode> local_60;
  Ref<embree::SceneGraph::SubdivMeshNode> local_58;
  Ref<embree::SceneGraph::QuadMeshNode> local_50;
  Ref<embree::SceneGraph::TriangleMeshNode> local_48;
  Ref<embree::SceneGraph::LightNode> local_40;
  Ref<embree::SceneGraph::AnimatedLightNode> local_38;
  
  p_Var4 = (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->nodeMap)._M_t._M_impl.super__Rb_tree_header;
    pNVar2 = node->ptr;
    p_Var17 = &p_Var1->_M_header;
    do {
      if (*(Node **)(p_Var4 + 1) >= pNVar2) {
        p_Var17 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(Node **)(p_Var4 + 1) < pNVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var17 != p_Var1) && (*(Node **)(p_Var17 + 1) <= pNVar2)) {
      if (this->ident != 0) {
        uVar18 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
          uVar18 = uVar18 + 1;
        } while (uVar18 < this->ident);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->field_0x10,"<ref id=\"",9);
      std::
      map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
      ::operator[](&this->nodeMap,node);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&this->field_0x10);
      goto LAB_0019a4b8;
    }
  }
  id = this->currentNodeID;
  this->currentNodeID = id + 1;
  pmVar5 = std::
           map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
           ::operator[](&this->nodeMap,node);
  *pmVar5 = id;
  iVar3 = std::__cxx11::string::compare((char *)&node->ptr->fileName);
  if (iVar3 != 0) {
    if (this->ident != 0) {
      uVar18 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
        uVar18 = uVar18 + 1;
      } while (uVar18 < this->ident);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x10,"<extern id=\"",0xc);
    poVar6 = std::ostream::_M_insert<long>((long)&this->field_0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" src=\"",7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(node->ptr->fileName)._M_dataplus._M_p,
                        (node->ptr->fileName)._M_string_length);
LAB_0019a4b8:
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"/>",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    return;
  }
  pNVar2 = node->ptr;
  if (pNVar2 != (Node *)0x0) {
    pAVar7 = (AnimatedLightNode *)
             __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                            &SceneGraph::AnimatedLightNode::typeinfo,0);
    if (pAVar7 == (AnimatedLightNode *)0x0) {
      pLVar8 = (LightNode *)
               __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,&SceneGraph::LightNode::typeinfo,0)
      ;
      if (pLVar8 == (LightNode *)0x0) {
        pTVar9 = (TriangleMeshNode *)
                 __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                &SceneGraph::TriangleMeshNode::typeinfo,0);
        if (pTVar9 == (TriangleMeshNode *)0x0) {
          pQVar10 = (QuadMeshNode *)
                    __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                   &SceneGraph::QuadMeshNode::typeinfo,0);
          if (pQVar10 == (QuadMeshNode *)0x0) {
            pSVar11 = (SubdivMeshNode *)
                      __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::SubdivMeshNode::typeinfo,0);
            if (pSVar11 == (SubdivMeshNode *)0x0) {
              pHVar12 = (HairSetNode *)
                        __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::HairSetNode::typeinfo,0);
              if (pHVar12 == (HairSetNode *)0x0) {
                pAVar13 = (AnimatedPerspectiveCameraNode *)
                          __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::AnimatedPerspectiveCameraNode::typeinfo,0);
                if (pAVar13 == (AnimatedPerspectiveCameraNode *)0x0) {
                  pPVar14 = (PerspectiveCameraNode *)
                            __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::PerspectiveCameraNode::typeinfo,0);
                  if (pPVar14 == (PerspectiveCameraNode *)0x0) {
                    pTVar15 = (TransformNode *)
                              __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::TransformNode::typeinfo,0);
                    if (pTVar15 == (TransformNode *)0x0) {
                      pGVar16 = (GroupNode *)
                                __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                               &SceneGraph::GroupNode::typeinfo,0);
                      if (pGVar16 == (GroupNode *)0x0) goto LAB_0019a86e;
                      (*(pGVar16->super_Node).super_RefCount._vptr_RefCount[2])(pGVar16);
                      local_80.ptr = pGVar16;
                      (*(pGVar16->super_Node).super_RefCount._vptr_RefCount[2])(pGVar16);
                      store(this,&local_80,id);
                      (*(pGVar16->super_Node).super_RefCount._vptr_RefCount[3])(pGVar16);
                      (*(pGVar16->super_Node).super_RefCount._vptr_RefCount[3])(pGVar16);
                    }
                    else {
                      (*(pTVar15->super_Node).super_RefCount._vptr_RefCount[2])(pTVar15);
                      local_78.ptr = pTVar15;
                      (*(pTVar15->super_Node).super_RefCount._vptr_RefCount[2])(pTVar15);
                      store(this,&local_78,id);
                      (*(pTVar15->super_Node).super_RefCount._vptr_RefCount[3])(pTVar15);
                      (*(pTVar15->super_Node).super_RefCount._vptr_RefCount[3])(pTVar15);
                    }
                  }
                  else {
                    (*(pPVar14->super_Node).super_RefCount._vptr_RefCount[2])(pPVar14);
                    local_70.ptr = pPVar14;
                    (*(pPVar14->super_Node).super_RefCount._vptr_RefCount[2])(pPVar14);
                    store(this,&local_70,id);
                    (*(pPVar14->super_Node).super_RefCount._vptr_RefCount[3])(pPVar14);
                    (*(pPVar14->super_Node).super_RefCount._vptr_RefCount[3])(pPVar14);
                  }
                }
                else {
                  (*(pAVar13->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount
                    [2])(pAVar13);
                  local_68.ptr = pAVar13;
                  (*(pAVar13->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount
                    [2])(pAVar13);
                  store(this,&local_68,id_01);
                  (*(pAVar13->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount
                    [3])(pAVar13);
                  (*(pAVar13->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount
                    [3])(pAVar13);
                }
              }
              else {
                (*(pHVar12->super_Node).super_RefCount._vptr_RefCount[2])(pHVar12);
                local_60.ptr = pHVar12;
                (*(pHVar12->super_Node).super_RefCount._vptr_RefCount[2])(pHVar12);
                store(this,&local_60,id);
                (*(pHVar12->super_Node).super_RefCount._vptr_RefCount[3])(pHVar12);
                (*(pHVar12->super_Node).super_RefCount._vptr_RefCount[3])(pHVar12);
              }
            }
            else {
              (*(pSVar11->super_Node).super_RefCount._vptr_RefCount[2])(pSVar11);
              local_58.ptr = pSVar11;
              (*(pSVar11->super_Node).super_RefCount._vptr_RefCount[2])(pSVar11);
              store(this,&local_58,id);
              (*(pSVar11->super_Node).super_RefCount._vptr_RefCount[3])(pSVar11);
              (*(pSVar11->super_Node).super_RefCount._vptr_RefCount[3])(pSVar11);
            }
          }
          else {
            (*(pQVar10->super_Node).super_RefCount._vptr_RefCount[2])(pQVar10);
            local_50.ptr = pQVar10;
            (*(pQVar10->super_Node).super_RefCount._vptr_RefCount[2])(pQVar10);
            store(this,&local_50,id);
            (*(pQVar10->super_Node).super_RefCount._vptr_RefCount[3])(pQVar10);
            (*(pQVar10->super_Node).super_RefCount._vptr_RefCount[3])(pQVar10);
          }
        }
        else {
          (*(pTVar9->super_Node).super_RefCount._vptr_RefCount[2])(pTVar9);
          local_48.ptr = pTVar9;
          (*(pTVar9->super_Node).super_RefCount._vptr_RefCount[2])(pTVar9);
          store(this,&local_48,id);
          (*(pTVar9->super_Node).super_RefCount._vptr_RefCount[3])(pTVar9);
          (*(pTVar9->super_Node).super_RefCount._vptr_RefCount[3])(pTVar9);
        }
      }
      else {
        (*(pLVar8->super_Node).super_RefCount._vptr_RefCount[2])(pLVar8);
        local_40.ptr = pLVar8;
        (*(pLVar8->super_Node).super_RefCount._vptr_RefCount[2])(pLVar8);
        store(this,&local_40,id);
        (*(pLVar8->super_Node).super_RefCount._vptr_RefCount[3])(pLVar8);
        (*(pLVar8->super_Node).super_RefCount._vptr_RefCount[3])(pLVar8);
      }
    }
    else {
      (*(pAVar7->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(pAVar7);
      local_38.ptr = pAVar7;
      (*(pAVar7->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(pAVar7);
      store(this,&local_38,id_00);
      (*(pAVar7->super_LightNode).super_Node.super_RefCount._vptr_RefCount[3])(pAVar7);
      (*(pAVar7->super_LightNode).super_Node.super_RefCount._vptr_RefCount[3])(pAVar7);
    }
    return;
  }
LAB_0019a86e:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unknown node type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::Node> node)
  {
    if (nodeMap.find(node) != nodeMap.end()) {
      tab(); xml << "<ref id=\"" << nodeMap[node] << "\"/>" << std::endl; return;
    }
    
    const ssize_t id = nodeMap[node] = currentNodeID++;
    if (node->fileName != "") {
      tab(); xml << "<extern id=\"" << id << "\" src=\"" << node->fileName << "\"/>" << std::endl; return;
    }

    if      (Ref<SceneGraph::AnimatedLightNode> cnode = node.dynamicCast<SceneGraph::AnimatedLightNode>()) store(cnode,id);
    else if (Ref<SceneGraph::LightNode> cnode = node.dynamicCast<SceneGraph::LightNode>()) store(cnode,id);
    //else if (Ref<SceneGraph::MaterialNode> cnode = node.dynamicCast<SceneGraph::MaterialNode>()) store(cnode,id);
    else if (Ref<SceneGraph::TriangleMeshNode> cnode = node.dynamicCast<SceneGraph::TriangleMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::QuadMeshNode> cnode = node.dynamicCast<SceneGraph::QuadMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::SubdivMeshNode> cnode = node.dynamicCast<SceneGraph::SubdivMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::HairSetNode> cnode = node.dynamicCast<SceneGraph::HairSetNode>()) store(cnode,id);
    else if (Ref<SceneGraph::AnimatedPerspectiveCameraNode> cnode = node.dynamicCast<SceneGraph::AnimatedPerspectiveCameraNode>()) store(cnode,id);
    else if (Ref<SceneGraph::PerspectiveCameraNode> cnode = node.dynamicCast<SceneGraph::PerspectiveCameraNode>()) store(cnode,id);
    else if (Ref<SceneGraph::TransformNode> cnode = node.dynamicCast<SceneGraph::TransformNode>()) store(cnode,id);
    else if (Ref<SceneGraph::GroupNode> cnode = node.dynamicCast<SceneGraph::GroupNode>()) store(cnode,id);
    else throw std::runtime_error("unknown node type");
  }